

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * GenImageGradientV(Image *__return_storage_ptr__,int width,int height,Color top,Color bottom)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [11];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  uint6 uVar24;
  uint6 uVar25;
  undefined1 auVar26 [16];
  void *pvVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  void *pvVar31;
  int i;
  ulong uVar32;
  ushort uVar33;
  short sVar34;
  float fVar35;
  undefined1 auVar38 [16];
  float fVar39;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar36;
  undefined6 uVar37;
  
  pvVar27 = malloc((long)(height * width) << 2);
  auVar26 = _DAT_00154940;
  Var14 = CONCAT81(SUB158(ZEXT815(0),7),bottom.a);
  auVar20._9_6_ = 0;
  auVar20._0_9_ = Var14;
  auVar15._1_10_ = SUB1510(auVar20 << 0x30,5);
  auVar15[0] = bottom.b;
  auVar21._11_4_ = 0;
  auVar21._0_11_ = auVar15;
  auVar16._1_12_ = SUB1512(auVar21 << 0x20,3);
  auVar16[0] = bottom.g;
  uVar33 = CONCAT11(0,bottom.r);
  auVar13._2_13_ = auVar16;
  auVar13._0_2_ = uVar33;
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar13._0_10_;
  auVar9._12_2_ = (short)Var14;
  uVar24 = CONCAT42(auVar9._10_4_,auVar15._0_2_);
  auVar17._6_8_ = 0;
  auVar17._0_6_ = uVar24;
  Var14 = CONCAT81(SUB158(ZEXT815(0),7),top.a);
  auVar22._9_6_ = 0;
  auVar22._0_9_ = Var14;
  auVar18._1_10_ = SUB1510(auVar22 << 0x30,5);
  auVar18[0] = top.b;
  auVar23._11_4_ = 0;
  auVar23._0_11_ = auVar18;
  auVar11[2] = top.g;
  auVar11._0_2_ = top._0_2_;
  auVar11._3_12_ = SUB1512(auVar23 << 0x20,3);
  auVar12._2_13_ = auVar11._2_13_;
  auVar12._0_2_ = top._0_2_ & 0xff;
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar12._0_10_;
  auVar8._12_2_ = (short)Var14;
  uVar25 = CONCAT42(auVar8._10_4_,auVar18._0_2_);
  auVar19._6_8_ = 0;
  auVar19._0_6_ = uVar25;
  auVar10._4_2_ = auVar11._2_2_;
  auVar10._0_4_ = auVar12._0_4_;
  auVar10._6_8_ = SUB148(auVar19 << 0x40,6);
  uVar28 = 0;
  uVar29 = 0;
  if (0 < width) {
    uVar29 = (ulong)(uint)width;
  }
  uVar30 = 0;
  if (0 < height) {
    uVar30 = (ulong)(uint)height;
  }
  pvVar31 = pvVar27;
  for (; uVar28 != uVar30; uVar28 = uVar28 + 1) {
    fVar35 = (float)(int)uVar28 / (float)height;
    fVar39 = 1.0 - fVar35;
    auVar38._0_4_ = (int)(fVar35 * (float)uVar33 + fVar39 * (float)(auVar12._0_4_ & 0xffff));
    auVar38._4_4_ =
         (int)(fVar35 * (float)(int)CONCAT82(SUB148(auVar17 << 0x40,6),auVar16._0_2_) +
              fVar39 * (float)auVar10._4_4_);
    auVar38._8_4_ = (int)(fVar35 * (float)(int)uVar24 + fVar39 * (float)(int)uVar25);
    auVar38._12_4_ =
         (int)(fVar35 * (float)(auVar9._10_4_ >> 0x10) + fVar39 * (float)(auVar8._10_4_ >> 0x10));
    auVar38 = auVar38 & auVar26;
    sVar5 = auVar38._0_2_;
    cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar38[0] - (0xff < sVar5);
    sVar5 = auVar38._2_2_;
    sVar34 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar38[2] - (0xff < sVar5),cVar1);
    sVar5 = auVar38._4_2_;
    cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar38[4] - (0xff < sVar5);
    sVar5 = auVar38._6_2_;
    uVar36 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar38[6] - (0xff < sVar5),
                      CONCAT12(cVar2,sVar34));
    sVar5 = auVar38._8_2_;
    cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar38[8] - (0xff < sVar5);
    sVar5 = auVar38._10_2_;
    uVar37 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar38[10] - (0xff < sVar5),
                      CONCAT14(cVar3,uVar36));
    sVar5 = auVar38._12_2_;
    cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar38[0xc] - (0xff < sVar5);
    sVar7 = auVar38._14_2_;
    sVar5 = (short)((uint)uVar36 >> 0x10);
    sVar6 = (short)((uint6)uVar37 >> 0x20);
    sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar38[0xe] - (0xff < sVar7),
                             CONCAT16(cVar4,uVar37)) >> 0x30);
    for (uVar32 = 0; uVar29 != uVar32; uVar32 = uVar32 + 1) {
      *(uint *)((long)pvVar31 + uVar32 * 4) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                      (0 < sVar34) * (sVar34 < 0x100) * cVar1 - (0xff < sVar34))));
    }
    pvVar31 = (void *)((long)pvVar31 + (long)width * 4);
  }
  __return_storage_ptr__->data = pvVar27;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientV(int width, int height, Color top, Color bottom)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int j = 0; j < height; j++)
    {
        float factor = (float)j/(float)height;
        for (int i = 0; i < width; i++)
        {
            pixels[j*width + i].r = (int)((float)bottom.r*factor + (float)top.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)bottom.g*factor + (float)top.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)bottom.b*factor + (float)top.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)bottom.a*factor + (float)top.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}